

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconhmp.cpp
# Opt level: O0

CVmFmtTabStop * CVmFmtTabStop::find(CVmHashTable *hashtab,wchar_t *id,int create)

{
  undefined1 auVar1 [16];
  void *pvVar2;
  ulong uVar3;
  undefined8 *puVar4;
  long *plVar5;
  CVmHashEntry *pCVar6;
  int in_EDX;
  wchar_t *in_RSI;
  CVmHashTable *in_RDI;
  size_t id_bytes;
  size_t id_chars;
  err_frame_t err_cur__;
  CVmFmtTabStop *entry;
  wchar_t *fid;
  size_t flen;
  size_t in_stack_fffffffffffffeb0;
  undefined8 uVar7;
  CVmHashEntry *in_stack_fffffffffffffeb8;
  wchar_t *in_stack_fffffffffffffec0;
  CVmHashTable *in_stack_fffffffffffffec8;
  uint local_110 [2];
  undefined8 local_108;
  void *local_100;
  __jmp_buf_tag _Stack_f8;
  CVmHashEntry *local_30;
  wchar_t *local_28;
  size_t local_20;
  int local_14;
  wchar_t *local_10;
  CVmHashTable *local_8;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_20 = fold_case(in_stack_fffffffffffffec0,(wchar_t *)in_stack_fffffffffffffeb8);
  local_28 = (wchar_t *)0x0;
  if (local_20 != 0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_20 + 1;
    uVar3 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    local_28 = (wchar_t *)operator_new__(uVar3);
  }
  local_30 = (CVmHashEntry *)0x0;
  puVar4 = (undefined8 *)_ZTW11G_err_frame();
  local_108 = *puVar4;
  plVar5 = (long *)_ZTW11G_err_frame();
  *plVar5 = (long)local_110;
  local_110[0] = _setjmp(&_Stack_f8);
  if (local_110[0] == 0) {
    if (local_28 != (wchar_t *)0x0) {
      fold_case(in_stack_fffffffffffffec0,(wchar_t *)in_stack_fffffffffffffeb8);
      local_10 = local_28;
    }
    wcslen(local_10);
    local_30 = CVmHashTable::find(in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0,
                                  (size_t)in_stack_fffffffffffffeb8);
    if ((local_30 == (CVmHashEntry *)0x0) && (local_14 != 0)) {
      pCVar6 = (CVmHashEntry *)operator_new(0x28);
      CVmFmtTabStop((CVmFmtTabStop *)local_8,(char *)in_stack_fffffffffffffeb8,
                    in_stack_fffffffffffffeb0);
      local_30 = pCVar6;
      CVmHashTable::add(local_8,in_stack_fffffffffffffeb8);
    }
  }
  if ((((local_110[0] & 0x8000) == 0) &&
      (local_110[0] = local_110[0] | 0x8000, local_28 != (wchar_t *)0x0)) &&
     (local_28 != (wchar_t *)0x0)) {
    operator_delete__(local_28);
  }
  uVar7 = local_108;
  puVar4 = (undefined8 *)_ZTW11G_err_frame();
  *puVar4 = uVar7;
  if ((local_110[0] & 0x4001) != 0) {
    puVar4 = (undefined8 *)_ZTW11G_err_frame();
    if ((*(uint *)*puVar4 & 2) != 0) {
      plVar5 = (long *)_ZTW11G_err_frame();
      free(*(void **)(*plVar5 + 0x10));
    }
    pvVar2 = local_100;
    plVar5 = (long *)_ZTW11G_err_frame();
    *(void **)(*plVar5 + 0x10) = pvVar2;
    err_rethrow();
  }
  if ((local_110[0] & 2) != 0) {
    free(local_100);
  }
  return (CVmFmtTabStop *)local_30;
}

Assistant:

static CVmFmtTabStop *find(CVmHashTable *hashtab, wchar_t *id, int create)
    {
        /* 
         *   Get the length - in characters AND in bytes - of the new ID.
         *   We mostly work with the new ID in bytes rather than wchar_t's,
         *   because the underlying hash table does everything in bytes.  
         */
        
        /* 
         *   Convert the new ID to folded case.  The hash table doesn't deal
         *   with unicode case conversions, so we use a case-sensitive hash
         *   table and simply make sure we only give it lower-case
         *   characters.  
         */
        size_t flen = fold_case(0, id);
        wchar_t *fid = 0;
        if (flen != 0)
            fid = new wchar_t[flen+1];

        CVmFmtTabStop *entry = 0;
        err_try
        {
            /* do the folding if applicable */
            if (fid != 0)
            {
                fold_case(fid, id);
                id = fid;
            }

            /* get the folded ID length in characters and bytes */
            size_t id_chars = wcslen(id);
            size_t id_bytes = id_chars * sizeof(wchar_t);
            
            /* look for an existing tab-stop entry with the same ID */
            entry = (CVmFmtTabStop *)hashtab->find((char *)id, id_bytes);
            
            /* if we didn't find it, and they want to create it, do so */
            if (entry == 0 && create)
                hashtab->add(entry = new CVmFmtTabStop((char *)id, id_bytes));
        }